

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cpp
# Opt level: O0

void test_type_conversion(void)

{
  uint32_t *puVar1;
  bool bVar2;
  uint16_t uVar3;
  version vVar4;
  uint32_t uVar5;
  int32_t iVar6;
  int iVar7;
  wostream *pwVar8;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar9;
  value *this;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  basic_string_view<char,_std::char_traits<char>_> local_b20;
  undefined1 local_b10 [8];
  string _r_38;
  string local_af0;
  value local_ae0;
  undefined1 local_ab8 [8];
  string _l_38;
  undefined1 local_a98 [8];
  string _r_37;
  string local_a78;
  value local_a68;
  undefined1 local_a40 [8];
  string _l_37;
  undefined1 local_a20 [8];
  string _r_36;
  undefined1 local_9e8 [8];
  string _l_36;
  undefined1 local_9c8 [8];
  string _r_35;
  undefined1 local_990 [8];
  string _l_35;
  undefined1 local_970 [8];
  string _r_34;
  undefined1 local_938 [8];
  string _l_34;
  undefined1 local_918 [8];
  string _r_33;
  undefined1 local_8e0 [8];
  string _l_33;
  undefined1 local_8c0 [8];
  string _r_32;
  undefined1 local_888 [8];
  string _l_32;
  undefined1 local_868 [8];
  string _r_31;
  undefined1 local_830 [8];
  string _l_31;
  undefined1 local_810 [8];
  string _r_30;
  undefined1 local_7d8 [8];
  string _l_30;
  undefined1 local_7b8 [8];
  string _r_29;
  string _l_29;
  undefined1 local_788 [8];
  string _r_28;
  string _l_28;
  int _r_27;
  uint16_t _l_27;
  int _r_26;
  int32_t _l_26;
  uint _r_25;
  uint32_t _l_25;
  unsigned_long_long _r_24;
  double local_720;
  double _l_24;
  undefined1 local_710 [4];
  int _r_23;
  double local_6e8;
  double _l_23;
  undefined1 local_6d8 [4];
  int _r_22;
  string local_6c8;
  value local_6b8;
  double local_690;
  double _l_22;
  double _r_21;
  string local_670;
  value local_660;
  double local_638;
  double _l_21;
  double _r_20;
  string local_618;
  value local_608;
  double local_5e0;
  double _l_20;
  double _r_19;
  double local_5a8;
  double _l_19;
  undefined1 local_598 [4];
  int _r_18;
  double local_570;
  double _l_18;
  undefined1 local_560 [4];
  int _r_17;
  double local_538;
  double _l_17;
  double dStack_528;
  int _r_16;
  double _l_16;
  value _r_15;
  value _l_15;
  bool _r_14;
  basic_string_view<char,_std::char_traits<char>_> local_4c0;
  string local_4b0;
  undefined1 local_4a0 [62];
  byte local_462;
  byte local_461;
  undefined1 local_460 [6];
  bool _l_14;
  bool _r_13;
  string local_450;
  value local_440;
  byte local_412;
  byte local_411;
  undefined1 local_410 [6];
  bool _l_13;
  bool _r_12;
  string local_400;
  value local_3f0;
  byte local_3c2;
  byte local_3c1;
  undefined1 local_3c0 [6];
  bool _l_12;
  bool _r_11;
  byte local_392;
  byte local_391;
  undefined1 local_390 [6];
  bool _l_11;
  bool _r_10;
  byte local_362;
  byte local_361;
  undefined1 local_360 [6];
  bool _l_10;
  bool _r_9;
  byte local_332;
  byte local_331;
  undefined1 local_330 [6];
  bool _l_9;
  bool _r_8;
  byte local_302;
  byte local_301;
  undefined1 local_300 [6];
  bool _l_8;
  bool _r_7;
  byte local_2d5;
  byte local_2d4;
  byte local_2d3;
  byte local_2d2;
  byte local_2d1;
  undefined1 local_2d0 [3];
  bool _l_7;
  bool _r_6;
  bool _l_6;
  bool _r_5;
  bool _l_5;
  string local_2c0;
  undefined1 local_2b0 [8];
  value _r_4;
  string local_278;
  value local_268;
  undefined1 local_240 [8];
  value _l_4;
  value _r_3;
  undefined1 local_1c8 [8];
  value _l_3;
  value _r_2;
  undefined1 local_150 [8];
  value _l_2;
  value _r_1;
  value _l_1;
  value _r;
  undefined1 local_a0 [8];
  value _l;
  gc_heap h;
  
  mjs::gc_heap::gc_heap
            ((gc_heap *)
             &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_,0x200);
  mjs::to_primitive((value *)local_a0,(value *)mjs::value::undefined,undefined);
  mjs::value::value((value *)&_l_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,(value *)mjs::value::undefined);
  bVar2 = mjs::operator!=((value *)local_a0,
                          (value *)&_l_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>
                                    .super_gc_heap_ptr_untyped.pos_);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x56);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_primitive(value::undefined)");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"value::undefined");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pbVar9 = operator<<(pwVar8,(value *)local_a0);
    pwVar8 = std::operator<<(pbVar9," != ");
    pbVar9 = operator<<(pwVar8,(value *)&_l_1.field_1.r_.property_name_.
                                         super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                                         .pos_);
    pwVar8 = std::operator<<(pbVar9,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::~value((value *)&_l_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)local_a0);
  mjs::to_primitive((value *)&_r_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,(value *)mjs::value::null,undefined);
  mjs::value::value((value *)&_l_2.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,(value *)mjs::value::null);
  bVar2 = mjs::operator!=((value *)&_r_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>
                                    .super_gc_heap_ptr_untyped.pos_,
                          (value *)&_l_2.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>
                                    .super_gc_heap_ptr_untyped.pos_);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x57);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_primitive(value::null)");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"value::null");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pbVar9 = operator<<(pwVar8,(value *)&_r_1.field_1.r_.property_name_.
                                         super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                                         .pos_);
    pwVar8 = std::operator<<(pbVar9," != ");
    pbVar9 = operator<<(pwVar8,(value *)&_l_2.field_1.r_.property_name_.
                                         super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                                         .pos_);
    pwVar8 = std::operator<<(pbVar9,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::~value((value *)&_l_2.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)&_r_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  mjs::value::value((value *)&_r_2.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,true);
  mjs::to_primitive((value *)local_150,
                    (value *)&_r_2.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,undefined);
  mjs::value::~value((value *)&_r_2.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  mjs::value::value((value *)&_l_3.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,true);
  bVar2 = mjs::operator!=((value *)local_150,
                          (value *)&_l_3.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>
                                    .super_gc_heap_ptr_untyped.pos_);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x58);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_primitive(value{true})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"value{true}");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pbVar9 = operator<<(pwVar8,(value *)local_150);
    pwVar8 = std::operator<<(pbVar9," != ");
    pbVar9 = operator<<(pwVar8,(value *)&_l_3.field_1.r_.property_name_.
                                         super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                                         .pos_);
    pwVar8 = std::operator<<(pbVar9,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::~value((value *)&_l_3.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)local_150);
  mjs::value::value((value *)&_r_3.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,42.0);
  mjs::to_primitive((value *)local_1c8,
                    (value *)&_r_3.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,undefined);
  mjs::value::~value((value *)&_r_3.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  mjs::value::value((value *)&_l_4.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,42.0);
  bVar2 = mjs::operator!=((value *)local_1c8,
                          (value *)&_l_4.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>
                                    .super_gc_heap_ptr_untyped.pos_);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x59);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_primitive(value{42.0})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"value{42.0}");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pbVar9 = operator<<(pwVar8,(value *)local_1c8);
    pwVar8 = std::operator<<(pbVar9," != ");
    pbVar9 = operator<<(pwVar8,(value *)&_l_4.field_1.r_.property_name_.
                                         super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                                         .pos_);
    pwVar8 = std::operator<<(pbVar9,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::~value((value *)&_l_4.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)local_1c8);
  puVar1 = &_r_4.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
            super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"test");
  mjs::string::string(&local_278,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  mjs::value::value(&local_268,&local_278);
  mjs::to_primitive((value *)local_240,&local_268,undefined);
  mjs::value::~value(&local_268);
  mjs::string::~string(&local_278);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_2d0,"test");
  mjs::string::string(&local_2c0,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_2d0);
  mjs::value::value((value *)local_2b0,&local_2c0);
  mjs::string::~string(&local_2c0);
  bVar2 = mjs::operator!=((value *)local_240,(value *)local_2b0);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x5a);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_primitive((value{string{h, \"test\"}}))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(value{string{h, \"test\"}})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pbVar9 = operator<<(pwVar8,(value *)local_240);
    pwVar8 = std::operator<<(pbVar9," != ");
    pbVar9 = operator<<(pwVar8,(value *)local_2b0);
    pwVar8 = std::operator<<(pbVar9,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::~value((value *)local_2b0);
  mjs::value::~value((value *)local_240);
  bVar2 = mjs::to_boolean((value *)mjs::value::undefined);
  local_2d1 = (bVar2 ^ 0xffU) & 1;
  local_2d2 = 1;
  if (local_2d1 != 1) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x5d);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"!!(!to_boolean(value::undefined))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_2d1 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_2d2 & 1));
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  bVar2 = mjs::to_boolean((value *)mjs::value::null);
  local_2d3 = (bVar2 ^ 0xffU) & 1;
  local_2d4 = 1;
  if (local_2d3 != 1) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x5e);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"!!(!to_boolean(value::null))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_2d3 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_2d4 & 1));
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)local_300,false);
  bVar2 = mjs::to_boolean((value *)local_300);
  mjs::value::~value((value *)local_300);
  local_2d5 = (bVar2 ^ 0xffU) & 1;
  local_301 = 1;
  if (local_2d5 != 1) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x5f);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"!!(!to_boolean(value{false}))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_2d5 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_301 & 1));
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)local_330,true);
  bVar2 = mjs::to_boolean((value *)local_330);
  mjs::value::~value((value *)local_330);
  local_331 = 1;
  local_302 = bVar2;
  if (!bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x60);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"!!(to_boolean(value{true}))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_302 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_331 & 1));
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)local_360,NAN);
  bVar2 = mjs::to_boolean((value *)local_360);
  mjs::value::~value((value *)local_360);
  local_332 = (bVar2 ^ 0xffU) & 1;
  local_361 = 1;
  if (local_332 != 1) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x61);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"!!(!to_boolean(value{(__builtin_nanf (\"\"))}))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_332 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_361 & 1));
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)local_390,0.0);
  bVar2 = mjs::to_boolean((value *)local_390);
  mjs::value::~value((value *)local_390);
  local_362 = (bVar2 ^ 0xffU) & 1;
  local_391 = 1;
  if (local_362 != 1) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x62);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"!!(!to_boolean(value{0.0}))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_362 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_391 & 1));
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)local_3c0,42.0);
  bVar2 = mjs::to_boolean((value *)local_3c0);
  mjs::value::~value((value *)local_3c0);
  local_3c1 = 1;
  local_392 = bVar2;
  if (!bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,99);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"!!(to_boolean(value{42.0}))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_392 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_3c1 & 1));
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_410,"");
  mjs::string::string(&local_400,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_410);
  mjs::value::value(&local_3f0,&local_400);
  bVar2 = mjs::to_boolean(&local_3f0);
  mjs::value::~value(&local_3f0);
  mjs::string::~string(&local_400);
  local_3c2 = (bVar2 ^ 0xffU) & 1;
  local_411 = 1;
  if (local_3c2 != 1) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,100);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"!!(!to_boolean(value{string{h,\"\"}}))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_3c2 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_411 & 1));
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_460,"test");
  mjs::string::string(&local_450,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_460);
  mjs::value::value(&local_440,&local_450);
  bVar2 = mjs::to_boolean(&local_440);
  mjs::value::~value(&local_440);
  mjs::string::~string(&local_450);
  local_461 = 1;
  local_412 = bVar2;
  if (!bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x65);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"!!(to_boolean(value{string{h,\"test\"}}))");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_412 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_461 & 1));
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4c0,"Object");
  mjs::string::string(&local_4b0,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,&local_4c0);
  mjs::gc_heap::make<mjs::object,mjs::string,decltype(nullptr)>
            ((gc_heap *)local_4a0,
             (string *)
             &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_,(void **)&local_4b0);
  mjs::value::value((value *)(local_4a0 + 0x10),(object_ptr *)local_4a0);
  bVar2 = mjs::to_boolean((value *)(local_4a0 + 0x10));
  mjs::value::~value((value *)(local_4a0 + 0x10));
  mjs::gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_4a0);
  mjs::string::~string(&local_4b0);
  local_462 = bVar2;
  if (!bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x66);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,
                             "!!(to_boolean(value{h.make<object>(string{h,\"Object\"}, nullptr)}))")
    ;
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"true");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,(bool)(local_462 & 1));
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,true);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  dVar10 = mjs::to_number((value *)mjs::value::undefined);
  mjs::value::value((value *)&_r_15.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                              super_gc_heap_ptr_untyped.pos_,dVar10);
  mjs::value::value((value *)&_l_16,NAN);
  bVar2 = mjs::operator!=((value *)&_r_15.field_1.r_.property_name_.
                                    super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                          ,(value *)&_l_16);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x68);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"value{to_number(value::undefined)}");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"value{NAN}");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pbVar9 = operator<<(pwVar8,(value *)&_r_15.field_1.r_.property_name_.
                                         super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
                                         .pos_);
    pwVar8 = std::operator<<(pbVar9," != ");
    pbVar9 = operator<<(pwVar8,(value *)&_l_16);
    pwVar8 = std::operator<<(pbVar9,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::~value((value *)&_l_16);
  mjs::value::~value((value *)&_r_15.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_);
  dStack_528 = mjs::to_number((value *)mjs::value::null);
  _l_17._4_4_ = 0;
  if ((dStack_528 != 0.0) || (NAN(dStack_528))) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x69);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_number(value::null)");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"0");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,dStack_528);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,_l_17._4_4_);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)local_560,false);
  dVar10 = mjs::to_number((value *)local_560);
  mjs::value::~value((value *)local_560);
  _l_18._4_4_ = 0;
  local_538 = dVar10;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x6a);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_number(value{false})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"0");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,local_538);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,_l_18._4_4_);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)local_598,true);
  dVar10 = mjs::to_number((value *)local_598);
  mjs::value::~value((value *)local_598);
  _l_19._4_4_ = 1;
  local_570 = dVar10;
  if ((dVar10 != 1.0) || (NAN(dVar10))) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x6b);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_number(value{true})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"1");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,local_570);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,_l_19._4_4_);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)&_r_19,42.0);
  dVar10 = mjs::to_number((value *)&_r_19);
  mjs::value::~value((value *)&_r_19);
  _l_20 = 42.0;
  local_5a8 = dVar10;
  if ((dVar10 != 42.0) || (NAN(dVar10))) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x6c);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_number(value{42.0})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"42.0");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,local_5a8);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,_l_20);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&_r_20,"42.25");
  mjs::string::string(&local_618,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,
                      (basic_string_view<char,_std::char_traits<char>_> *)&_r_20);
  mjs::value::value(&local_608,&local_618);
  dVar10 = mjs::to_number(&local_608);
  mjs::value::~value(&local_608);
  mjs::string::~string(&local_618);
  _l_21 = 42.25;
  local_5e0 = dVar10;
  if ((dVar10 != 42.25) || (NAN(dVar10))) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x6d);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_number(value{string{h,\"42.25\"}})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"42.25");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,local_5e0);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,_l_21);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&_r_21,"1e80");
  mjs::string::string(&local_670,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,
                      (basic_string_view<char,_std::char_traits<char>_> *)&_r_21);
  mjs::value::value(&local_660,&local_670);
  dVar10 = mjs::to_number(&local_660);
  mjs::value::~value(&local_660);
  mjs::string::~string(&local_670);
  _l_22 = 1e+80;
  local_638 = dVar10;
  if ((dVar10 != 1e+80) || (NAN(dVar10))) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x6e);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_number(value{string{h,\"1e80\"}})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"1e80");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,local_638);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,_l_22);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_6d8,"-60");
  mjs::string::string(&local_6c8,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_6d8);
  mjs::value::value(&local_6b8,&local_6c8);
  dVar10 = mjs::to_number(&local_6b8);
  mjs::value::~value(&local_6b8);
  mjs::string::~string(&local_6c8);
  _l_23._4_4_ = -0x3c;
  local_690 = dVar10;
  if ((dVar10 != -60.0) || (NAN(dVar10))) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x6f);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_number(value{string{h,\"-60\"}})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"-60");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,local_690);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,_l_23._4_4_);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)local_710,-42.25);
  dVar10 = mjs::to_integer((value *)local_710);
  mjs::value::~value((value *)local_710);
  _l_24._4_4_ = -0x2a;
  local_6e8 = dVar10;
  if ((dVar10 != -42.0) || (NAN(dVar10))) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x73);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_integer(value{-42.25})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"-42");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,local_6e8);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,_l_24._4_4_);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::value::value((value *)&_r_24,4294967296.0);
  dVar10 = mjs::to_integer((value *)&_r_24);
  this = (value *)&_r_24;
  mjs::value::~value(this);
  auVar12._8_4_ = 1;
  auVar12._0_8_ = 0x100000000;
  auVar12._12_4_ = 0x45300000;
  dVar11 = (auVar12._8_8_ - 1.9342813113834067e+25) + 0.0;
  local_720 = dVar10;
  if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x74);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_integer(value{1.0*(1ULL<<32)})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(1ULL<<32)");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,local_720);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x100000000);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  uVar5 = mjs::to_uint32((mjs *)this,8589934591.0);
  if (uVar5 != 0xffffffff) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x76);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_uint32(0x1\'ffff\'ffff)");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"0xffff\'ffff");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,uVar5);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0xffffffff);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  iVar6 = mjs::to_int32((mjs *)this,8589934591.0);
  if (iVar6 != -1) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x77);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_int32(0x1\'ffff\'ffff)");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"-1");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,iVar6);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,-1);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  uVar3 = mjs::to_uint16((mjs *)this,8589934591.0);
  if (uVar3 != 0xffff) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x78);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_uint16(0x1\'ffff\'ffff)");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"0xffff");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,uVar3);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0xffff);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::to_string((mjs *)&_r_28.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,(value *)mjs::value::undefined);
  puVar1 = &_l_29.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"undefined");
  mjs::string::string((string *)local_788,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)
                          &_r_28.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,
                          (string *)local_788);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x7a);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value::undefined)");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"undefined\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)
                                    &_r_28.super_gc_heap_ptr<mjs::gc_string>.
                                     super_gc_heap_ptr_untyped.pos_);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_788);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_788);
  mjs::string::~string
            ((string *)&_r_28.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  mjs::to_string((mjs *)&_r_29.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,(value *)mjs::value::null);
  puVar1 = &_l_30.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"null");
  mjs::string::string((string *)local_7b8,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)
                          &_r_29.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,
                          (string *)local_7b8);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x7b);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value::null)");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"null\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)
                                    &_r_29.super_gc_heap_ptr<mjs::gc_string>.
                                     super_gc_heap_ptr_untyped.pos_);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_7b8);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_7b8);
  mjs::string::~string
            ((string *)&_r_29.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  mjs::value::value((value *)&_r_30.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                    ,false);
  mjs::to_string((mjs *)local_7d8,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,
                 (value *)&_r_30.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)&_r_30.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                               pos_);
  puVar1 = &_l_31.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"false");
  mjs::string::string((string *)local_810,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)local_7d8,(string *)local_810);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x7c);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value{false})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"false\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_7d8);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_810);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_810);
  mjs::string::~string((string *)local_7d8);
  mjs::value::value((value *)&_r_31.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                    ,true);
  mjs::to_string((mjs *)local_830,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,
                 (value *)&_r_31.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)&_r_31.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                               pos_);
  puVar1 = &_l_32.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"true");
  mjs::string::string((string *)local_868,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)local_830,(string *)local_868);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x7d);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value{true})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"true\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_830);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_868);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_868);
  mjs::string::~string((string *)local_830);
  mjs::value::value((value *)&_r_32.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                    ,NAN);
  mjs::to_string((mjs *)local_888,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,
                 (value *)&_r_32.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)&_r_32.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                               pos_);
  puVar1 = &_l_33.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"NaN");
  mjs::string::string((string *)local_8c0,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)local_888,(string *)local_8c0);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x7e);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value{NAN})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"NaN\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_888);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_8c0);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_8c0);
  mjs::string::~string((string *)local_888);
  mjs::value::value((value *)&_r_33.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                    ,-0.0);
  mjs::to_string((mjs *)local_8e0,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,
                 (value *)&_r_33.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)&_r_33.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                               pos_);
  puVar1 = &_l_34.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"0");
  mjs::string::string((string *)local_918,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)local_8e0,(string *)local_918);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x7f);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value{-0.0})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"0\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_8e0);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_918);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_918);
  mjs::string::~string((string *)local_8e0);
  mjs::value::value((value *)&_r_34.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                    ,INFINITY);
  mjs::to_string((mjs *)local_938,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,
                 (value *)&_r_34.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)&_r_34.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                               pos_);
  puVar1 = &_l_35.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"Infinity");
  mjs::string::string((string *)local_970,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)local_938,(string *)local_970);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x80);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value{+INFINITY})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"Infinity\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_938);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_970);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_970);
  mjs::string::~string((string *)local_938);
  mjs::value::value((value *)&_r_35.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                    ,-INFINITY);
  mjs::to_string((mjs *)local_990,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,
                 (value *)&_r_35.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)&_r_35.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                               pos_);
  puVar1 = &_l_36.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"-Infinity");
  mjs::string::string((string *)local_9c8,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)local_990,(string *)local_9c8);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x81);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value{-INFINITY})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"-Infinity\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_990);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_9c8);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_9c8);
  mjs::string::~string((string *)local_990);
  mjs::value::value((value *)&_r_36.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                    ,42.25);
  mjs::to_string((mjs *)local_9e8,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,
                 (value *)&_r_36.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
  mjs::value::~value((value *)&_r_36.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                               pos_);
  puVar1 = &_l_37.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"42.25");
  mjs::string::string((string *)local_a20,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)local_9e8,(string *)local_a20);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x82);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value{42.25})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"42.25\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_9e8);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_a20);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_a20);
  mjs::string::~string((string *)local_9e8);
  puVar1 = &_r_37.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"");
  mjs::string::string(&local_a78,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  mjs::value::value(&local_a68,&local_a78);
  mjs::to_string((mjs *)local_a40,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,&local_a68);
  mjs::value::~value(&local_a68);
  mjs::string::~string(&local_a78);
  puVar1 = &_l_38.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"");
  mjs::string::string((string *)local_a98,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  bVar2 = mjs::operator!=((string *)local_a40,(string *)local_a98);
  if (bVar2) {
    pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar8 = std::operator<<(pwVar8," in ");
    pwVar8 = std::operator<<(pwVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar8 = std::operator<<(pwVar8,":");
    pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x83);
    pwVar8 = std::operator<<(pwVar8,":\n");
    pwVar8 = std::operator<<(pwVar8,"to_string(h, value{string{h, \"\"}})");
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = std::operator<<(pwVar8,"(string{h, \"\"})");
    pwVar8 = std::operator<<(pwVar8,"\n");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_a40);
    pwVar8 = std::operator<<(pwVar8," != ");
    pwVar8 = mjs::operator<<(pwVar8,(string *)local_a98);
    pwVar8 = std::operator<<(pwVar8,"\n");
    vVar4 = tested_version();
    pbVar9 = mjs::operator<<(pwVar8,vVar4);
    std::operator<<(pbVar9,"\n");
    abort();
  }
  mjs::string::~string((string *)local_a98);
  mjs::string::~string((string *)local_a40);
  puVar1 = &_r_38.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)puVar1,"test");
  mjs::string::string(&local_af0,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,(string_view *)puVar1);
  mjs::value::value(&local_ae0,&local_af0);
  mjs::to_string((mjs *)local_ab8,
                 (gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,&local_ae0);
  mjs::value::~value(&local_ae0);
  mjs::string::~string(&local_af0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b20,"test");
  mjs::string::string((string *)local_b10,
                      (gc_heap *)
                      &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_,&local_b20);
  bVar2 = mjs::operator!=((string *)local_ab8,(string *)local_b10);
  if (!bVar2) {
    mjs::string::~string((string *)local_b10);
    mjs::string::~string((string *)local_ab8);
    mjs::gc_heap::garbage_collect
              ((gc_heap *)
               &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_);
    iVar7 = mjs::gc_heap::use_percentage
                      ((gc_heap *)
                       &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                        super_gc_heap_ptr_untyped.pos_);
    if (iVar7 == 0) {
      mjs::gc_heap::~gc_heap
                ((gc_heap *)
                 &_l.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_);
      return;
    }
    __assert_fail("h.use_percentage() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                  ,0x88,"void test_type_conversion()");
  }
  pwVar8 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
  pwVar8 = std::operator<<(pwVar8," in ");
  pwVar8 = std::operator<<(pwVar8,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                          );
  pwVar8 = std::operator<<(pwVar8,":");
  pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,0x84);
  pwVar8 = std::operator<<(pwVar8,":\n");
  pwVar8 = std::operator<<(pwVar8,"to_string(h, value{string{h, \"test\"}})");
  pwVar8 = std::operator<<(pwVar8," != ");
  pwVar8 = std::operator<<(pwVar8,"(string{h, \"test\"})");
  pwVar8 = std::operator<<(pwVar8,"\n");
  pwVar8 = mjs::operator<<(pwVar8,(string *)local_ab8);
  pwVar8 = std::operator<<(pwVar8," != ");
  pwVar8 = mjs::operator<<(pwVar8,(string *)local_b10);
  pwVar8 = std::operator<<(pwVar8,"\n");
  vVar4 = tested_version();
  pbVar9 = mjs::operator<<(pwVar8,vVar4);
  std::operator<<(pbVar9,"\n");
  abort();
}

Assistant:

void test_type_conversion() {
    gc_heap h{1<<9};
    // TODO: to_primitive hint
    REQUIRE_EQ(to_primitive(value::undefined), value::undefined);
    REQUIRE_EQ(to_primitive(value::null), value::null);
    REQUIRE_EQ(to_primitive(value{true}), value{true});
    REQUIRE_EQ(to_primitive(value{42.0}), value{42.0});
    REQUIRE_EQ(to_primitive((value{string{h, "test"}})), (value{string{h, "test"}}));
    // TODO: Object

    REQUIRE(!to_boolean(value::undefined));
    REQUIRE(!to_boolean(value::null));
    REQUIRE(!to_boolean(value{false}));
    REQUIRE(to_boolean(value{true}));
    REQUIRE(!to_boolean(value{NAN}));
    REQUIRE(!to_boolean(value{0.0}));
    REQUIRE(to_boolean(value{42.0}));
    REQUIRE(!to_boolean(value{string{h,""}}));
    REQUIRE(to_boolean(value{string{h,"test"}}));
    REQUIRE(to_boolean(value{h.make<object>(string{h,"Object"}, nullptr)}));

    REQUIRE_EQ(value{to_number(value::undefined)}, value{NAN});
    REQUIRE_EQ(to_number(value::null), 0);
    REQUIRE_EQ(to_number(value{false}), 0);
    REQUIRE_EQ(to_number(value{true}), 1);
    REQUIRE_EQ(to_number(value{42.0}), 42.0);
    REQUIRE_EQ(to_number(value{string{h,"42.25"}}), 42.25);
    REQUIRE_EQ(to_number(value{string{h,"1e80"}}), 1e80);
    REQUIRE_EQ(to_number(value{string{h,"-60"}}), -60);
    // TODO: Object


    REQUIRE_EQ(to_integer(value{-42.25}), -42);
    REQUIRE_EQ(to_integer(value{1.0*(1ULL<<32)}), (1ULL<<32));

    REQUIRE_EQ(to_uint32(0x1'ffff'ffff), 0xffff'ffff);
    REQUIRE_EQ(to_int32(0x1'ffff'ffff), -1);
    REQUIRE_EQ(to_uint16(0x1'ffff'ffff), 0xffff);

    REQUIRE_EQ(to_string(h, value::undefined), (string{h, "undefined"}));
    REQUIRE_EQ(to_string(h, value::null), (string{h, "null"}));
    REQUIRE_EQ(to_string(h, value{false}), (string{h, "false"}));
    REQUIRE_EQ(to_string(h, value{true}), (string{h, "true"}));
    REQUIRE_EQ(to_string(h, value{NAN}), (string{h, "NaN"}));
    REQUIRE_EQ(to_string(h, value{-0.0}), (string{h, "0"}));
    REQUIRE_EQ(to_string(h, value{+INFINITY}), (string{h, "Infinity"}));
    REQUIRE_EQ(to_string(h, value{-INFINITY}), (string{h, "-Infinity"}));
    REQUIRE_EQ(to_string(h, value{42.25}), (string{h, "42.25"}));
    REQUIRE_EQ(to_string(h, value{string{h, ""}}), (string{h, ""}));
    REQUIRE_EQ(to_string(h, value{string{h, "test"}}), (string{h, "test"}));
    // TODO: Object

    h.garbage_collect();
    assert(h.use_percentage() == 0);
}